

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamTaperedTimoshenkoFPM.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamTaperedTimoshenkoFPM::EvaluateSectionDisplacement
          (ChElementBeamTaperedTimoshenkoFPM *this,double eta,ChVector<double> *u_displ,
          ChVector<double> *u_rotaz)

{
  double *pdVar1;
  double *pdVar2;
  undefined8 uVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  double *pdVar10;
  double *pdVar11;
  double *pdVar12;
  double *pdVar13;
  int iVar14;
  void *__ptr;
  undefined8 *puVar15;
  ulong uVar16;
  double *pdVar17;
  long lVar18;
  double dVar19;
  double dVar21;
  undefined1 auVar20 [16];
  ChVectorDynamic<> displ;
  ChMatrixNM<double,_6,_12> Nx;
  ShapeFunctionGroupFPM NxBx;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_760;
  double local_748;
  undefined1 local_740 [64];
  double local_700 [64];
  ShapeFunctionGroupFPM local_500;
  
  local_748 = eta;
  iVar14 = (*(this->super_ChElementBeamTaperedTimoshenko).super_ChElementBeam.super_ChElementGeneric
             .super_ChElementBase._vptr_ChElementBase[3])();
  local_760.m_storage.m_data = (double *)0x0;
  local_760.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_760,(long)iVar14);
  (*(this->super_ChElementBeamTaperedTimoshenko).super_ChElementBeam.super_ChElementGeneric.
    super_ChElementBase._vptr_ChElementBase[6])(this,&local_760);
  ShapeFunctionsTimoshenkoFPM(this,&local_500,local_748);
  memcpy(local_740,
         &local_500.
          super__Tuple_impl<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_Eigen::Matrix<double,_6,_12,_1,_6,_12>_>
          .super__Head_base<0UL,_Eigen::Matrix<double,_6,_12,_1,_6,_12>,_false>,0x240);
  if (local_760.m_storage.m_rows != 0xc) {
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                  "Eigen::Product<Eigen::Matrix<double, 6, 12, 1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, 6, 12, 1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
                 );
  }
  __ptr = malloc(0x70);
  pdVar13 = local_760.m_storage.m_data;
  if (__ptr == (void *)0x0) {
    puVar15 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar15 = std::ostream::_M_insert<bool>;
    __cxa_throw(puVar15,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  uVar16 = (ulong)__ptr & 0xffffffffffffffc0;
  pdVar17 = local_700;
  lVar18 = 0;
  *(void **)(uVar16 + 0x38) = __ptr;
  do {
    pdVar1 = pdVar17 + -4;
    pdVar4 = pdVar17 + -3;
    pdVar5 = pdVar17 + -2;
    pdVar6 = pdVar17 + -1;
    dVar19 = *pdVar17;
    pdVar7 = pdVar17 + 1;
    pdVar8 = pdVar17 + 2;
    pdVar9 = pdVar17 + 3;
    pdVar2 = pdVar17 + -8;
    pdVar10 = pdVar17 + -7;
    pdVar11 = pdVar17 + -6;
    pdVar12 = pdVar17 + -5;
    pdVar17 = pdVar17 + 0xc;
    dVar19 = *pdVar2 * *local_760.m_storage.m_data +
             *pdVar1 * local_760.m_storage.m_data[4] + dVar19 * local_760.m_storage.m_data[8] +
             *pdVar11 * local_760.m_storage.m_data[2] +
             *pdVar5 * local_760.m_storage.m_data[6] + *pdVar8 * local_760.m_storage.m_data[10];
    dVar21 = *pdVar10 * local_760.m_storage.m_data[1] +
             *pdVar4 * local_760.m_storage.m_data[5] + *pdVar7 * local_760.m_storage.m_data[9] +
             *pdVar12 * local_760.m_storage.m_data[3] +
             *pdVar6 * local_760.m_storage.m_data[7] + *pdVar9 * local_760.m_storage.m_data[0xb];
    auVar20._0_8_ = dVar19 + dVar21;
    auVar20._8_8_ = dVar19 + dVar21;
    uVar3 = vmovlpd_avx(auVar20);
    *(undefined8 *)(uVar16 + 0x40 + lVar18 * 8) = uVar3;
    lVar18 = lVar18 + 1;
  } while (lVar18 != 6);
  u_displ->m_data[0] = *(double *)(uVar16 + 0x40);
  u_displ->m_data[1] = *(double *)(uVar16 + 0x48);
  u_displ->m_data[2] = *(double *)(uVar16 + 0x50);
  u_rotaz->m_data[0] = *(double *)(uVar16 + 0x58);
  u_rotaz->m_data[1] = *(double *)(uVar16 + 0x60);
  u_rotaz->m_data[2] = *(double *)(uVar16 + 0x68);
  free(__ptr);
  free((void *)pdVar13[-1]);
  return;
}

Assistant:

void ChElementBeamTaperedTimoshenkoFPM::EvaluateSectionDisplacement(const double eta,
                                                                    ChVector<>& u_displ,
                                                                    ChVector<>& u_rotaz) {
    ChVectorDynamic<> displ(this->GetNdofs());
    this->GetStateBlock(displ);
    // No transformation for the displacement of two nodes,
    // so the section displacement is evaluated at the centerline of beam

    ShapeFunctionGroupFPM NxBx;
    ShapeFunctionsTimoshenkoFPM(NxBx, eta);
    // the shape function matrix
    ChMatrixNM<double, 6, 12> Nx = std::get<0>(NxBx);

    // the displacements and rotations, as a vector
    ChVectorDynamic<> u_vector = Nx * displ;

    u_displ.x() = u_vector(0);
    u_displ.y() = u_vector(1);
    u_displ.z() = u_vector(2);
    u_rotaz.x() = u_vector(3);
    u_rotaz.y() = u_vector(4);
    u_rotaz.z() = u_vector(5);
}